

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QVariant * __thiscall QTreeWidgetItem::childrenCheckState(QTreeWidgetItem *this,int column)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  const_iterator o;
  QTreeWidgetItem **ppQVar4;
  uint in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *child;
  QList<QTreeWidgetItem_*> *__range1;
  bool uncheckedChildren;
  bool checkedChildren;
  const_iterator __end1;
  const_iterator __begin1;
  QVariant value;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  const_iterator local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_EDX < 0) {
    ::QVariant::QVariant((QVariant *)0x915352);
  }
  else {
    bVar2 = false;
    bVar1 = false;
    local_30.i = (QTreeWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QTreeWidgetItem_*>::begin
                         ((QList<QTreeWidgetItem_*> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    o = QList<QTreeWidgetItem_*>::end
                  ((QList<QTreeWidgetItem_*> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    while (bVar3 = QList<QTreeWidgetItem_*>::const_iterator::operator!=(&local_30,o), bVar3) {
      ppQVar4 = QList<QTreeWidgetItem_*>::const_iterator::operator*(&local_30);
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (*(*ppQVar4)->_vptr_QTreeWidgetItem[3])(&local_28,*ppQVar4,(ulong)in_EDX,10);
      bVar3 = ::QVariant::isValid((QVariant *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (bVar3) {
        in_stack_ffffffffffffff74 = ::QVariant::toInt((bool *)local_28.data);
        if (in_stack_ffffffffffffff74 == 0) {
          bVar1 = true;
        }
        else {
          if ((in_stack_ffffffffffffff74 == 1) || (in_stack_ffffffffffffff74 != 2)) {
            ::QVariant::QVariant(in_RDI,1);
            bVar3 = true;
            goto LAB_009154e4;
          }
          bVar2 = true;
        }
        if ((bVar1) && (bVar2)) {
          ::QVariant::QVariant(in_RDI,1);
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        ::QVariant::QVariant((QVariant *)0x91544f);
        bVar3 = true;
      }
LAB_009154e4:
      ::QVariant::~QVariant((QVariant *)&local_28);
      if (bVar3) goto LAB_00915542;
      QList<QTreeWidgetItem_*>::const_iterator::operator++(&local_30);
    }
    if (bVar1) {
      ::QVariant::QVariant(in_RDI,0);
    }
    else if (bVar2) {
      ::QVariant::QVariant(in_RDI,2);
    }
    else {
      ::QVariant::QVariant((QVariant *)0x915542);
    }
  }
LAB_00915542:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QVariant QTreeWidgetItem::childrenCheckState(int column) const
{
    if (column < 0)
        return QVariant();
    bool checkedChildren = false;
    bool uncheckedChildren = false;
    for (const auto *child : children) {
        QVariant value = child->data(column, Qt::CheckStateRole);
        if (!value.isValid())
            return QVariant();

        switch (static_cast<Qt::CheckState>(value.toInt()))
        {
        case Qt::Unchecked:
            uncheckedChildren = true;
            break;
        case Qt::Checked:
            checkedChildren = true;
            break;
        case Qt::PartiallyChecked:
        default:
            return Qt::PartiallyChecked;
        }

        if (uncheckedChildren && checkedChildren)
            return Qt::PartiallyChecked;
    }

    if (uncheckedChildren)
        return Qt::Unchecked;
    else if (checkedChildren)
        return Qt::Checked;
    else
        return QVariant(); // value was not defined
}